

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::SwapPositionsInAEL(Clipper *this,TEdge *edge1,TEdge *edge2)

{
  TEdge *pTVar1;
  TEdge *pTVar2;
  TEdge *next;
  TEdge *pTVar3;
  
  pTVar1 = edge1->nextInAEL;
  if ((pTVar1 == (TEdge *)0x0) && (edge1->prevInAEL == (TEdge *)0x0)) {
    return;
  }
  pTVar2 = edge2->nextInAEL;
  if (pTVar2 == (TEdge *)0x0) {
    if (edge2->prevInAEL == (TEdge *)0x0) {
      return;
    }
    if (pTVar1 == edge2) goto LAB_006695fd;
    pTVar3 = edge1->prevInAEL;
    edge1->nextInAEL = (TEdge *)0x0;
  }
  else {
    if (pTVar1 == edge2) {
      pTVar2->prevInAEL = edge1;
LAB_006695fd:
      pTVar1 = edge1->prevInAEL;
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->nextInAEL = edge2;
      }
      edge2->prevInAEL = pTVar1;
      edge2->nextInAEL = edge1;
      edge1->prevInAEL = edge2;
      edge1->nextInAEL = pTVar2;
      goto LAB_00669642;
    }
    if (pTVar2 == edge1) {
      if (pTVar1 != (TEdge *)0x0) {
        pTVar1->prevInAEL = edge2;
      }
      pTVar2 = edge2->prevInAEL;
      if (pTVar2 != (TEdge *)0x0) {
        pTVar2->nextInAEL = edge1;
      }
      edge1->prevInAEL = pTVar2;
      edge1->nextInAEL = edge2;
      edge2->prevInAEL = edge1;
      edge2->nextInAEL = pTVar1;
      goto LAB_00669642;
    }
    pTVar3 = edge1->prevInAEL;
    edge1->nextInAEL = pTVar2;
    pTVar2->prevInAEL = edge1;
  }
  pTVar2 = edge2->prevInAEL;
  edge1->prevInAEL = pTVar2;
  if (pTVar2 != (TEdge *)0x0) {
    pTVar2->nextInAEL = edge1;
  }
  edge2->nextInAEL = pTVar1;
  if (pTVar1 != (TEdge *)0x0) {
    pTVar1->prevInAEL = edge2;
  }
  edge2->prevInAEL = pTVar3;
  if (pTVar3 != (TEdge *)0x0) {
    pTVar3->nextInAEL = edge2;
  }
LAB_00669642:
  if ((edge1->prevInAEL != (TEdge *)0x0) && (edge1 = edge2, edge2->prevInAEL != (TEdge *)0x0)) {
    return;
  }
  this->m_ActiveEdges = edge1;
  return;
}

Assistant:

void Clipper::SwapPositionsInAEL(TEdge *edge1, TEdge *edge2)
{
  if(  !edge1->nextInAEL &&  !edge1->prevInAEL ) return;
  if(  !edge2->nextInAEL &&  !edge2->prevInAEL ) return;

  if(  edge1->nextInAEL == edge2 )
  {
    TEdge* next = edge2->nextInAEL;
    if( next ) next->prevInAEL = edge1;
    TEdge* prev = edge1->prevInAEL;
    if( prev ) prev->nextInAEL = edge2;
    edge2->prevInAEL = prev;
    edge2->nextInAEL = edge1;
    edge1->prevInAEL = edge2;
    edge1->nextInAEL = next;
  }
  else if(  edge2->nextInAEL == edge1 )
  {
    TEdge* next = edge1->nextInAEL;
    if( next ) next->prevInAEL = edge2;
    TEdge* prev = edge2->prevInAEL;
    if( prev ) prev->nextInAEL = edge1;
    edge1->prevInAEL = prev;
    edge1->nextInAEL = edge2;
    edge2->prevInAEL = edge1;
    edge2->nextInAEL = next;
  }
  else
  {
    TEdge* next = edge1->nextInAEL;
    TEdge* prev = edge1->prevInAEL;
    edge1->nextInAEL = edge2->nextInAEL;
    if( edge1->nextInAEL ) edge1->nextInAEL->prevInAEL = edge1;
    edge1->prevInAEL = edge2->prevInAEL;
    if( edge1->prevInAEL ) edge1->prevInAEL->nextInAEL = edge1;
    edge2->nextInAEL = next;
    if( edge2->nextInAEL ) edge2->nextInAEL->prevInAEL = edge2;
    edge2->prevInAEL = prev;
    if( edge2->prevInAEL ) edge2->prevInAEL->nextInAEL = edge2;
  }

  if( !edge1->prevInAEL ) m_ActiveEdges = edge1;
  else if( !edge2->prevInAEL ) m_ActiveEdges = edge2;
}